

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O0

HelicsEndpoint
helicsFederateRegisterGlobalTargetedEndpoint
          (HelicsFederate fed,char *name,char *type,HelicsError *err)

{
  string_view type_00;
  string_view eptName;
  bool bVar1;
  element_type *peVar2;
  Endpoint *pEVar3;
  pointer pEVar4;
  FedObject *pFVar5;
  long in_RDX;
  long in_RSI;
  __single_object end;
  shared_ptr<helics::MessageFederate> fedObj;
  shared_ptr<helics::MessageFederate> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  HelicsError *err_00;
  char *in_stack_ffffffffffffff58;
  MessageFederate *in_stack_ffffffffffffff60;
  unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_> *this;
  HelicsFederate in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  _Head_base<0UL,_helics::EndpointObject_*,_false> in_stack_ffffffffffffff80;
  unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>
  *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  __shared_ptr local_38 [24];
  long local_20;
  long local_18;
  HelicsEndpoint local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  getMessageFedSharedPtr(in_stack_ffffffffffffff68,(HelicsError *)in_stack_ffffffffffffff60);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_38);
  if (bVar1) {
    std::make_unique<helics::EndpointObject>();
    peVar2 = std::
             __shared_ptr_access<helics::MessageFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::MessageFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1dd877);
    if (local_18 == 0) {
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff50);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff58);
    }
    if (local_20 == 0) {
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff50);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff58);
    }
    eptName._M_str = (char *)in_stack_ffffffffffffff80._M_head_impl;
    eptName._M_len = (size_t)peVar2;
    type_00._M_str = in_stack_ffffffffffffff70;
    type_00._M_len = (size_t)in_stack_ffffffffffffff68;
    pEVar3 = helics::MessageFederate::registerGlobalTargetedEndpoint
                       (in_stack_ffffffffffffff60,eptName,type_00);
    err_00 = (HelicsError *)&stack0xffffffffffffffb8;
    pEVar4 = std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>::
             operator->((unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>
                         *)0x1dd91a);
    pEVar4->endPtr = pEVar3;
    std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>::
    operator->((unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_> *)
               0x1dd92c);
    std::shared_ptr<helics::MessageFederate>::operator=
              ((shared_ptr<helics::MessageFederate> *)err_00,in_stack_ffffffffffffff48);
    pFVar5 = helics::getFedObject(in_stack_ffffffffffffff58,err_00);
    pEVar4 = std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>::
             operator->((unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>
                         *)0x1dd95f);
    pEVar4->fed = pFVar5;
    this = (unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_> *)
           &stack0xffffffffffffff80;
    std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>::
    unique_ptr((unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_> *)
               err_00,(unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>
                       *)pFVar5);
    local_8 = anon_unknown.dwarf_784a3::addEndpoint
                        ((HelicsFederate)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffb8);
    std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>::
    ~unique_ptr(this);
    std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>::
    ~unique_ptr(this);
  }
  else {
    local_8 = (HelicsEndpoint)0x0;
  }
  std::shared_ptr<helics::MessageFederate>::~shared_ptr
            ((shared_ptr<helics::MessageFederate> *)0x1dda6e);
  return local_8;
}

Assistant:

HelicsEndpoint helicsFederateRegisterGlobalTargetedEndpoint(HelicsFederate fed, const char* name, const char* type, HelicsError* err)
{
    // now generate a generic subscription
    auto fedObj = getMessageFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    try {
        auto end = std::make_unique<helics::EndpointObject>();
        end->endPtr = &fedObj->registerGlobalTargetedEndpoint(AS_STRING_VIEW(name), AS_STRING_VIEW(type));
        end->fedptr = std::move(fedObj);
        end->fed = helics::getFedObject(fed, nullptr);
        return addEndpoint(fed, std::move(end));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}